

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::CharMap
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this,int defv)

{
  int local_18;
  int i;
  int defv_local;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  BVStatic<256UL>::BVStatic(&this->isInMap);
  this->defv = defv;
  this->root = (Type)0x0;
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    this->directMap[local_18] = defv;
  }
  return;
}

Assistant:

CharMap(V defv)
            : defv(defv)
            , root(0)
        {
            for (int i = 0; i < directSize; i++)
                directMap[i] = defv;
        }